

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  pointer ppNVar1;
  Node **it;
  pointer ppNVar2;
  
  TraverseHeaviestBundle(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppNVar1 = (this->consensus_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar2 = (this->consensus_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1; ppNVar2 = ppNVar2 + 1
      ) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph::GenerateConsensus() {
  TraverseHeaviestBundle();
  std::string dst{};
  for (const auto& it : consensus_) {
    dst += decoder_[it->code];
  }
  return dst;
}